

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O3

int __thiscall Fl_Tabs::tab_height(Fl_Tabs *this)

{
  int iVar1;
  int iVar2;
  Fl_Widget **ppFVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  
  iVar8 = (this->super_Fl_Group).super_Fl_Widget.h_;
  iVar5 = iVar8;
  if ((this->super_Fl_Group).children_ != 0) {
    iVar5 = (this->super_Fl_Group).super_Fl_Widget.y_;
    ppFVar3 = Fl_Group::array(&this->super_Fl_Group);
    iVar4 = (this->super_Fl_Group).super_Fl_Widget.y_;
    iVar1 = (this->super_Fl_Group).children_;
    if (iVar1 != 0) {
      lVar6 = 0;
      do {
        iVar7 = ppFVar3[lVar6]->y_;
        iVar2 = iVar7 - iVar4;
        if (iVar4 + iVar8 <= iVar7) {
          iVar2 = iVar8;
        }
        iVar8 = iVar2;
        iVar7 = iVar7 + ppFVar3[lVar6]->h_;
        if (iVar7 <= iVar5) {
          iVar7 = iVar5;
        }
        iVar5 = iVar7;
        lVar6 = lVar6 + 1;
      } while (iVar1 != (int)lVar6);
    }
    iVar4 = (iVar4 - iVar5) + (this->super_Fl_Group).super_Fl_Widget.h_;
    if (iVar8 < iVar4) {
      iVar5 = 0;
      if (0 < iVar4) {
        iVar5 = -iVar4;
      }
    }
    else {
      iVar5 = 0;
      if (0 < iVar8) {
        iVar5 = iVar8;
      }
    }
  }
  return iVar5;
}

Assistant:

int Fl_Tabs::tab_height() {
  if (children() == 0) return h();
  int H = h();
  int H2 = y();
  Fl_Widget*const* a = array();
  for (int i=children(); i--;) {
    Fl_Widget* o = *a++;
    if (o->y() < y()+H) H = o->y()-y();
    if (o->y()+o->h() > H2) H2 = o->y()+o->h();
  }
  H2 = y()+h()-H2;
  if (H2 > H) return (H2 <= 0) ? 0 : -H2;
  else return (H <= 0) ? 0 : H;
}